

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O0

int __thiscall kstream<gzFile_s_*,_FunctorZlib>::getHeader(kstream<gzFile_s_*,_FunctorZlib> *this)

{
  ostream *this_00;
  FILE *in_RSI;
  kstream<gzFile_s_*,_FunctorZlib> *in_RDI;
  bool bVar1;
  int c;
  int local_14;
  int local_4;
  
  do {
    local_14 = getc(in_RDI,in_RSI);
    bVar1 = false;
    if ((local_14 != -1) && (bVar1 = false, local_14 != 0x3e)) {
      bVar1 = local_14 != 0x40;
    }
  } while (bVar1);
  if (local_14 == -1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"ERROR: The file appears to be empty");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else {
    if ((local_14 == 0x3e) || (local_14 == 0x40)) {
      in_RDI->begin = in_RDI->begin + -1;
      local_14 = 10;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int getHeader() {
        int c;
        while ((c = this->getc()) != -1 && c != '>' && c != '@');
        if (c == -1) {
            std::cerr << "ERROR: The file appears to be empty" << std::endl;
            return -1;
        }
        if (c == int('>') || c == int('@')){
            begin--;
            c = int('\n');
        }
        return c;
    }